

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjEncodeYUVPlanes(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                     uchar **dstPlanes,int *strides,int subsamp,int flags)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *__ptr;
  long lVar7;
  JSAMPLE *pJVar8;
  JSAMPROW *ppJVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  JSAMPROW pJVar18;
  tjinstance *this;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  char *pcVar23;
  uchar *_tmpbuf_aligned;
  long *in_FS_OFFSET;
  size_t sStack_260;
  JSAMPROW *tmpbuf2 [10];
  int pw [10];
  JSAMPROW *outbuf [10];
  JSAMPROW *tmpbuf [10];
  JSAMPLE *_tmpbuf2 [10];
  JSAMPLE *_tmpbuf [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    tmpbuf[lVar6] = (JSAMPROW *)0x0;
    _tmpbuf[lVar6] = (JSAMPLE *)0x0;
    tmpbuf2[lVar6] = (JSAMPROW *)0x0;
    _tmpbuf2[lVar6] = (JSAMPLE *)0x0;
    outbuf[lVar6] = (JSAMPROW *)0x0;
  }
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    pcVar23 = "tjEncodeYUVPlanes(): Instance has not been initialized for compression";
    sStack_260 = 0x47;
LAB_0010ca44:
    memcpy((void *)((long)handle + 0x608),pcVar23,sStack_260);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),pcVar23,sStack_260);
  }
  else if (((((dstPlanes == (uchar **)0x0 || 0xb < (uint)pixelFormat) ||
              ((height < 1 || srcBuf == (uchar *)0x0) || (pitch < 0 || width < 1))) ||
            (5 < (uint)subsamp)) || (*dstPlanes == (uchar *)0x0)) ||
          ((subsamp != 3 && ((dstPlanes[1] == (uchar *)0x0 || (dstPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xb2) = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x766e49203a292873;
    in_FS_OFFSET[-0x17] = 0x6772612064696c61;
    in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
  else {
    if (pixelFormat == 0xb) {
      pcVar23 = "tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels";
      sStack_260 = 0x41;
      goto LAB_0010ca44;
    }
    if (pitch == 0) {
      pitch = tjPixelSize[(uint)pixelFormat] * width;
    }
    iVar4 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar4 != 0) goto LAB_0010cb6c;
    *(int *)((long)handle + 0x30) = width;
    *(int *)((long)handle + 0x34) = height;
    if ((flags & 8U) == 0) {
      if ((flags & 0x10U) != 0) {
        pcVar23 = "JSIMD_FORCESSE=1";
        goto LAB_0010cc71;
      }
      if ((flags & 0x20U) != 0) {
        pcVar23 = "JSIMD_FORCESSE2=1";
        goto LAB_0010cc71;
      }
    }
    else {
      pcVar23 = "JSIMD_FORCEMMX=1";
LAB_0010cc71:
      putenv(pcVar23);
    }
    setCompDefaults((jpeg_compress_struct *)handle,pixelFormat,subsamp,-1,flags);
    if (*(int *)((long)handle + 0x24) == 100) {
      (**(code **)(*handle + 0x20))(handle);
      jinit_c_master_control((j_compress_ptr)handle,0);
      jinit_color_converter((j_compress_ptr)handle);
      jinit_downsampler((j_compress_ptr)handle);
      (*(code *)**(undefined8 **)((long)handle + 0x1d8))(handle);
      iVar4 = *(int *)((long)handle + 0x138);
      uVar15 = *(uint *)((long)handle + 0x13c);
      uVar22 = -uVar15 & (uVar15 + height) - 1;
      __ptr = malloc((long)(int)uVar22 << 3);
      if (__ptr == (void *)0x0) {
        builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
        builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
        builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
        in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
        in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
        in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
        in_FS_OFFSET[-0x19] = 0x656e616c50565559;
        __ptr = (void *)0x0;
        uVar15 = 0xffffffff;
      }
      else {
        uVar17 = (ulong)(uint)height;
        for (uVar19 = 0; uVar17 = uVar17 - 1, uVar19 != (uint)height; uVar19 = uVar19 + 1) {
          uVar14 = uVar17;
          if ((flags & 2U) == 0) {
            uVar14 = uVar19;
          }
          *(uchar **)((long)__ptr + uVar19 * 8) = srcBuf + uVar14 * (long)pitch;
        }
        if (height < (int)uVar22) {
          puVar13 = (undefined8 *)((long)__ptr + (ulong)(uint)height * 8);
          for (iVar11 = height; iVar11 < (int)uVar22; iVar11 = iVar11 + 1) {
            *puVar13 = *(undefined8 *)((long)__ptr + (ulong)(uint)height * 8 + -8);
            puVar13 = puVar13 + 1;
          }
        }
        uVar12 = 0;
        if (0 < (int)uVar15) {
          uVar12 = uVar15;
        }
        uVar2 = *(uint *)((long)handle + 0x4c);
        if ((int)*(uint *)((long)handle + 0x4c) < 1) {
          uVar2 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar2; uVar17 = uVar17 + 1) {
          lVar6 = *(long *)((long)handle + 0x58);
          lVar7 = uVar17 * 0x60;
          uVar1 = *(uint *)(lVar6 + 8 + lVar7);
          iVar11 = *(int *)(lVar6 + 0x1c + lVar7);
          uVar20 = (uint)(iVar4 * 8 * iVar11) / uVar1 + 0x1f & 0xffffffe0;
          pJVar8 = (JSAMPLE *)malloc((ulong)(uVar15 * uVar20 + 0x20));
          _tmpbuf[uVar17] = pJVar8;
          if (pJVar8 == (JSAMPLE *)0x0) {
LAB_0010d01d:
            builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
            builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
            builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
            builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
            builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
            builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
            builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
            in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
            in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
            in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
            in_FS_OFFSET[-0x19] = 0x656e616c50565559;
            goto LAB_0010d06c;
          }
          ppJVar9 = (JSAMPROW *)malloc((long)(int)uVar15 * 8);
          tmpbuf[uVar17] = ppJVar9;
          if (ppJVar9 == (JSAMPROW *)0x0) goto LAB_0010d01d;
          for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
            ppJVar9[uVar19] =
                 (JSAMPROW)
                 ((ulong)(uVar20 * (int)uVar19) + ((ulong)(pJVar8 + 0x1f) & 0xffffffffffffffe0));
          }
          uVar21 = iVar11 * 8 + 0x1fU & 0xffffffe0;
          uVar20 = *(uint *)(lVar6 + lVar7 + 0xc);
          pJVar8 = (JSAMPLE *)malloc((ulong)(uVar20 * uVar21 + 0x20));
          _tmpbuf2[uVar17] = pJVar8;
          if (pJVar8 == (JSAMPLE *)0x0) goto LAB_0010d01d;
          ppJVar9 = (JSAMPROW *)malloc((long)(int)uVar20 * 8);
          tmpbuf2[uVar17] = ppJVar9;
          if (ppJVar9 == (JSAMPROW *)0x0) goto LAB_0010d01d;
          uVar19 = 0;
          uVar16 = 0;
          uVar3 = 0;
          if (0 < (int)uVar20) {
            uVar3 = uVar20;
          }
          for (; uVar3 != uVar19; uVar19 = uVar19 + 1) {
            ppJVar9[uVar19] =
                 (JSAMPROW)((ulong)uVar16 + ((ulong)(pJVar8 + 0x1f) & 0xffffffffffffffe0));
            uVar16 = uVar16 + uVar21;
          }
          iVar11 = (int)(uVar1 * (-iVar4 & (width + iVar4) - 1U)) / iVar4;
          pw[uVar17] = iVar11;
          uVar19 = (long)(int)(uVar20 * uVar22) / (long)(int)uVar15;
          iVar5 = (int)uVar19;
          uVar19 = uVar19 & 0xffffffff;
          ppJVar9 = (JSAMPROW *)malloc((long)iVar5 << 3);
          outbuf[uVar17] = ppJVar9;
          if (ppJVar9 == (JSAMPROW *)0x0) goto LAB_0010d01d;
          pJVar18 = dstPlanes[uVar17];
          uVar14 = 0;
          if (iVar5 < 1) {
            uVar19 = 0;
          }
          for (; uVar19 != uVar14; uVar14 = uVar14 + 1) {
            ppJVar9[uVar14] = pJVar18;
            if ((strides == (int *)0x0) || (iVar5 = strides[uVar17], strides[uVar17] == 0)) {
              iVar5 = iVar11;
            }
            pJVar18 = pJVar18 + iVar5;
          }
        }
        iVar4 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar4 == 0) {
          for (iVar4 = 0; iVar4 < (int)uVar22; iVar4 = iVar4 + *(int *)((long)handle + 0x13c)) {
            (**(code **)(*(long *)((long)handle + 0x1d8) + 8))
                      (handle,(void *)((long)__ptr + (long)iVar4 * 8),tmpbuf,0,
                       *(undefined4 *)((long)handle + 0x13c));
            (**(code **)(*(long *)((long)handle + 0x1e0) + 8))(handle,tmpbuf,0,tmpbuf2,0);
            piVar10 = (int *)(*(long *)((long)handle + 0x58) + 0xc);
            for (lVar6 = 0; lVar6 < *(int *)((long)handle + 0x4c); lVar6 = lVar6 + 1) {
              jcopy_sample_rows(tmpbuf2[lVar6],0,outbuf[lVar6],
                                (*piVar10 * iVar4) / *(int *)((long)handle + 0x13c),*piVar10,
                                pw[lVar6]);
              piVar10 = piVar10 + 0x18;
            }
          }
          *(int *)((long)handle + 0x130) = *(int *)((long)handle + 0x130) + height;
          jpeg_abort_compress((j_compress_ptr)handle);
          uVar15 = 0;
        }
        else {
LAB_0010d06c:
          uVar15 = 0xffffffff;
        }
      }
      goto LAB_0010cb71;
    }
    builtin_strncpy((char *)((long)handle + 0x628)," is in t",8);
    builtin_strncpy((char *)((long)handle + 0x630),"he wrong",8);
    builtin_strncpy((char *)((long)handle + 0x618),"s(): lib",8);
    builtin_strncpy((char *)((long)handle + 0x620),"jpeg API",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x637) = 0x65746174732067;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xa1) = 0x65746174732067;
    in_FS_OFFSET[-0x16] = 0x74206e6920736920;
    in_FS_OFFSET[-0x15] = 0x676e6f7277206568;
    in_FS_OFFSET[-0x18] = 0x62696c203a292873;
    in_FS_OFFSET[-0x17] = 0x495041206765706a;
    in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
LAB_0010cb6c:
  uVar15 = 0xffffffff;
  __ptr = (void *)0x0;
LAB_0010cb71:
  if (100 < *(int *)((long)handle + 0x24)) {
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  free(__ptr);
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    free(tmpbuf[lVar6]);
    free(_tmpbuf[lVar6]);
    free(tmpbuf2[lVar6]);
    free(_tmpbuf2[lVar6]);
    free(outbuf[lVar6]);
  }
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar15;
}

Assistant:

DLLEXPORT int tjEncodeYUVPlanes(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pitch, int height,
                                int pixelFormat, unsigned char **dstPlanes,
                                int *strides, int subsamp, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS], *_tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *outbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;

  GET_CINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;
    tmpbuf2[i] = NULL;  _tmpbuf2[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjEncodeYUVPlanes(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || !dstPlanes ||
      !dstPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjEncodeYUVPlanes(): Invalid argument");

  if (pixelFormat == TJPF_CMYK)
    THROW("tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  setCompDefaults(cinfo, pixelFormat, subsamp, -1, flags);

  /* Execute only the parts of jpeg_start_compress() that we need.  If we
     were to call the whole jpeg_start_compress() function, then it would try
     to write the file headers, which could overflow the output buffer if the
     YUV image were very small. */
  if (cinfo->global_state != CSTATE_START)
    THROW("tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  jinit_c_master_control(cinfo, FALSE);
  jinit_color_converter(cinfo);
  jinit_downsampler(cinfo);
  (*cinfo->cconvert->start_pass) (cinfo);

  pw0 = PAD(width, cinfo->max_h_samp_factor);
  ph0 = PAD(height, cinfo->max_v_samp_factor);

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjEncodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < cinfo->num_components; i++) {
    compptr = &cinfo->comp_info[i];
    _tmpbuf[i] = (JSAMPLE *)malloc(
      PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
          compptr->h_samp_factor, 32) *
      cinfo->max_v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] =
      (JSAMPROW *)malloc(sizeof(JSAMPROW) * cinfo->max_v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < cinfo->max_v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] = &_tmpbuf_aligned[
        PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
            compptr->h_samp_factor, 32) * row];
    }
    _tmpbuf2[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf2[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf2_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf2[i], 32);

      tmpbuf2[i][row] =
        &_tmpbuf2_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / cinfo->max_v_samp_factor;
    outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!outbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += cinfo->max_v_samp_factor) {
    (*cinfo->cconvert->color_convert) (cinfo, &row_pointer[row], tmpbuf, 0,
                                       cinfo->max_v_samp_factor);
    (cinfo->downsample->downsample) (cinfo, tmpbuf, 0, tmpbuf2, 0);
    for (i = 0, compptr = cinfo->comp_info; i < cinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(tmpbuf2[i], 0, outbuf[i],
        row * compptr->v_samp_factor / cinfo->max_v_samp_factor,
        compptr->v_samp_factor, pw[i]);
  }
  cinfo->next_scanline += height;
  jpeg_abort_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) jpeg_abort_compress(cinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(tmpbuf2[i]);
    free(_tmpbuf2[i]);
    free(outbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}